

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O0

void tcg_gen_gvec_2i_x86_64
               (TCGContext *tcg_ctx,uint32_t dofs,uint32_t aofs,uint32_t oprsz,uint32_t maxsz,
               int64_t c,GVecGen2i *g)

{
  _Bool _Var1;
  uint oprsz_00;
  TCGOpcode *n;
  TCGv_i64 c_00;
  int32_t c_01;
  TCGOpcode *local_50;
  TCGv_i64 tcg_c;
  uint32_t some;
  TCGType type;
  TCGOpcode *hold_list;
  TCGOpcode *this_list;
  int64_t c_local;
  uint32_t maxsz_local;
  uint32_t oprsz_local;
  uint32_t aofs_local;
  uint32_t dofs_local;
  TCGContext *tcg_ctx_local;
  
  if (g->opt_opc == (TCGOpcode *)0x0) {
    local_50 = (TCGOpcode *)0x0;
  }
  else {
    local_50 = g->opt_opc;
  }
  n = tcg_swap_vecop_list(local_50);
  check_size_align(oprsz,maxsz,dofs | aofs);
  check_overlap_2(dofs,aofs,maxsz);
  tcg_c._4_4_ = TCG_TYPE_I32;
  if (g->fniv != (_func_void_TCGContext_ptr_uint_TCGv_vec_TCGv_vec_int64_t *)0x0) {
    tcg_c._4_4_ = choose_vector_type(tcg_ctx,g->opt_opc,(uint)g->vece,oprsz,
                                     (_Bool)(g->prefer_i64 & 1));
  }
  c_local._0_4_ = maxsz;
  c_local._4_4_ = oprsz;
  maxsz_local = aofs;
  oprsz_local = dofs;
  switch(tcg_c._4_4_) {
  case TCG_TYPE_I32:
    if ((g->fni8 == (_func_void_TCGContext_ptr_TCGv_i64_TCGv_i64_int64_t *)0x0) ||
       (_Var1 = check_size_impl(oprsz,8), !_Var1)) {
      c_01 = (int32_t)c;
      if ((g->fni4 == (_func_void_TCGContext_ptr_TCGv_i32_TCGv_i32_int32_t *)0x0) ||
         (_Var1 = check_size_impl(oprsz,4), !_Var1)) {
        c_local._4_4_ = maxsz;
        if (g->fno == (gen_helper_gvec_2 *)0x0) {
          c_00 = tcg_const_i64_x86_64(tcg_ctx,c);
          tcg_gen_gvec_2i_ool_x86_64(tcg_ctx,dofs,aofs,c_00,oprsz,maxsz,c_01,g->fnoi);
          tcg_temp_free_i64(tcg_ctx,c_00);
        }
        else {
          tcg_gen_gvec_2_ool_x86_64(tcg_ctx,dofs,aofs,oprsz,maxsz,c_01,g->fno);
        }
      }
      else {
        expand_2i_i32(tcg_ctx,dofs,aofs,oprsz,c_01,(_Bool)(g->load_dest & 1),g->fni4);
      }
    }
    else {
      expand_2i_i64(tcg_ctx,dofs,aofs,oprsz,c,(_Bool)(g->load_dest & 1),g->fni8);
    }
    break;
  default:
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg-op-gvec.c"
               ,0x47c,(char *)0x0);
  case TCG_TYPE_V64:
    expand_2i_vec(tcg_ctx,(uint)g->vece,dofs,aofs,oprsz,8,TCG_TYPE_V64,c,(_Bool)(g->load_dest & 1),
                  g->fniv);
    break;
  case TCG_TYPE_V256:
    oprsz_00 = oprsz & 0xffffffe0;
    expand_2i_vec(tcg_ctx,(uint)g->vece,dofs,aofs,oprsz_00,0x20,TCG_TYPE_V256,c,
                  (_Bool)(g->load_dest & 1),g->fniv);
    if (oprsz_00 == oprsz) break;
    oprsz_local = oprsz_00 + dofs;
    maxsz_local = oprsz_00 + aofs;
    c_local._4_4_ = oprsz - oprsz_00;
    c_local._0_4_ = maxsz - oprsz_00;
  case TCG_TYPE_V128:
    expand_2i_vec(tcg_ctx,(uint)g->vece,oprsz_local,maxsz_local,c_local._4_4_,0x10,TCG_TYPE_V128,c,
                  (_Bool)(g->load_dest & 1),g->fniv);
  }
  tcg_swap_vecop_list(n);
  if (c_local._4_4_ < (uint32_t)c_local) {
    expand_clr(tcg_ctx,oprsz_local + c_local._4_4_,(uint32_t)c_local - c_local._4_4_);
  }
  return;
}

Assistant:

void tcg_gen_gvec_2i(TCGContext *tcg_ctx, uint32_t dofs, uint32_t aofs, uint32_t oprsz,
                     uint32_t maxsz, int64_t c, const GVecGen2i *g)
{
    const TCGOpcode *this_list = g->opt_opc ? g->opt_opc : vecop_list_empty;
    const TCGOpcode *hold_list = tcg_swap_vecop_list(this_list);
    TCGType type;
    uint32_t some;

    check_size_align(oprsz, maxsz, dofs | aofs);
    check_overlap_2(dofs, aofs, maxsz);

    type = 0;
    if (g->fniv) {
        type = choose_vector_type(tcg_ctx, g->opt_opc, g->vece, oprsz, g->prefer_i64);
    }
    switch (type) {
    case TCG_TYPE_V256:
        /* Recall that ARM SVE allows vector sizes that are not a
         * power of 2, but always a multiple of 16.  The intent is
         * that e.g. size == 80 would be expanded with 2x32 + 1x16.
         */
        some = QEMU_ALIGN_DOWN(oprsz, 32);
        expand_2i_vec(tcg_ctx, g->vece, dofs, aofs, some, 32, TCG_TYPE_V256,
                      c, g->load_dest, g->fniv);
        if (some == oprsz) {
            break;
        }
        dofs += some;
        aofs += some;
        oprsz -= some;
        maxsz -= some;
        /* fallthru */
    case TCG_TYPE_V128:
        expand_2i_vec(tcg_ctx, g->vece, dofs, aofs, oprsz, 16, TCG_TYPE_V128,
                      c, g->load_dest, g->fniv);
        break;
    case TCG_TYPE_V64:
        expand_2i_vec(tcg_ctx, g->vece, dofs, aofs, oprsz, 8, TCG_TYPE_V64,
                      c, g->load_dest, g->fniv);
        break;

    case 0:
        if (g->fni8 && check_size_impl(oprsz, 8)) {
            expand_2i_i64(tcg_ctx, dofs, aofs, oprsz, c, g->load_dest, g->fni8);
        } else if (g->fni4 && check_size_impl(oprsz, 4)) {
            expand_2i_i32(tcg_ctx, dofs, aofs, oprsz, c, g->load_dest, g->fni4);
        } else {
            if (g->fno) {
                tcg_gen_gvec_2_ool(tcg_ctx, dofs, aofs, oprsz, maxsz, c, g->fno);
            } else {
                TCGv_i64 tcg_c = tcg_const_i64(tcg_ctx, c);
                tcg_gen_gvec_2i_ool(tcg_ctx, dofs, aofs, tcg_c, oprsz,
                                    maxsz, c, g->fnoi);
                tcg_temp_free_i64(tcg_ctx, tcg_c);
            }
            oprsz = maxsz;
        }
        break;

    default:
        g_assert_not_reached();
    }
    tcg_swap_vecop_list(hold_list);

    if (oprsz < maxsz) {
        expand_clr(tcg_ctx, dofs + oprsz, maxsz - oprsz);
    }
}